

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O2

int __thiscall lightconf::writer::writer(writer *this,UI *ui,UI_STRING *uis)

{
  int extraout_EAX;
  initializer_list<int> __l;
  allocator_type local_65;
  int local_64;
  _Deque_base<int,_std::allocator<int>_> local_60;
  
  (this->buf)._M_dataplus._M_p = (pointer)&(this->buf).field_2;
  (this->buf)._M_string_length = 0;
  (this->buf).field_2._M_local_buf[0] = '\0';
  local_64 = 0;
  __l._M_len = 1;
  __l._M_array = &local_64;
  std::deque<int,_std::allocator<int>_>::deque
            ((deque<int,_std::allocator<int>_> *)&local_60,__l,&local_65);
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&this->tabstops,&local_60);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_60);
  this->line = 0;
  this->col = 0;
  return extraout_EAX;
}

Assistant:

writer() :
        tabstops({0}),
        line(0),
        col(0)
    { }